

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * google::protobuf::internal::
       FieldParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                 (uint64 tag,UnknownFieldLiteParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  LogMessage *other;
  char *pcVar1;
  uint32 num;
  uint64 value;
  LogFinisher local_51;
  LogMessage local_50;
  
  num = (uint32)(tag >> 3);
  if (num == 0) {
    return (char *)0x0;
  }
  switch((uint)tag & 7) {
  case 0:
    pcVar1 = VarintParse<unsigned_long>(ptr,(unsigned_long *)&local_50);
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
    UnknownFieldLiteParserHelper::AddVarint(field_parser,num,local_50._0_8_);
    return pcVar1;
  case 1:
    UnknownFieldLiteParserHelper::AddFixed64(field_parser,num,*(uint64 *)ptr);
    return ptr + 8;
  case 2:
    pcVar1 = UnknownFieldLiteParserHelper::ParseLengthDelimited(field_parser,num,ptr,ctx);
    break;
  case 3:
    pcVar1 = UnknownFieldLiteParserHelper::ParseGroup(field_parser,num,ptr,ctx);
    break;
  case 4:
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/parse_context.h"
               ,0x2b7);
    other = LogMessage::operator<<(&local_50,"Can\'t happen");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
    return ptr;
  case 5:
    UnknownFieldLiteParserHelper::AddFixed32(field_parser,num,*(uint32 *)ptr);
    return ptr + 4;
  default:
    goto LAB_00280c2a;
  }
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
LAB_00280c2a:
  return (char *)0x0;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* FieldParser(uint64 tag, T& field_parser,
                                                 const char* ptr,
                                                 ParseContext* ctx) {
  uint32 number = tag >> 3;
  GOOGLE_PROTOBUF_PARSER_ASSERT(number != 0);
  using WireType = internal::WireFormatLite::WireType;
  switch (tag & 7) {
    case WireType::WIRETYPE_VARINT: {
      uint64 value;
      ptr = VarintParse(ptr, &value);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      field_parser.AddVarint(number, value);
      break;
    }
    case WireType::WIRETYPE_FIXED64: {
      uint64 value = UnalignedLoad<uint64>(ptr);
      ptr += 8;
      field_parser.AddFixed64(number, value);
      break;
    }
    case WireType::WIRETYPE_LENGTH_DELIMITED: {
      ptr = field_parser.ParseLengthDelimited(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_START_GROUP: {
      ptr = field_parser.ParseGroup(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_END_GROUP: {
      GOOGLE_LOG(FATAL) << "Can't happen";
      break;
    }
    case WireType::WIRETYPE_FIXED32: {
      uint32 value = UnalignedLoad<uint32>(ptr);
      ptr += 4;
      field_parser.AddFixed32(number, value);
      break;
    }
    default:
      return nullptr;
  }
  return ptr;
}